

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O0

void Fra_LcrRemapPartitions(Vec_Ptr_t *vParts,Fra_Cla_t *pCla,int *pInToOutPart,int *pInToOutNum)

{
  Vec_Ptr_t *p;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  void *pvVar5;
  long *plVar6;
  int local_5c;
  int local_58;
  int c;
  int k;
  int i;
  int Offset;
  int Out;
  Aig_Obj_t *pObjPi;
  Aig_Obj_t **ppClass;
  Vec_Int_t *vOneNew;
  Vec_Int_t *vOne;
  int *pInToOutNum_local;
  int *pInToOutPart_local;
  Fra_Cla_t *pCla_local;
  Vec_Ptr_t *vParts_local;
  
  iVar1 = Aig_ManCoNum(pCla->pAig);
  iVar2 = Aig_ManCiNum(pCla->pAig);
  for (c = 0; iVar3 = Vec_PtrSize(vParts), c < iVar3; c = c + 1) {
    p_00 = (Vec_Int_t *)Vec_PtrEntry(vParts,c);
    iVar3 = Vec_IntSize(p_00);
    p_01 = Vec_IntAlloc(iVar3);
    for (local_58 = 0; iVar3 = Vec_IntSize(p_00), local_58 < iVar3; local_58 = local_58 + 1) {
      iVar3 = Vec_IntEntry(p_00,local_58);
      iVar4 = Vec_PtrSize(pCla->vClasses);
      if (iVar3 < iVar4) {
        pvVar5 = Vec_PtrEntry(pCla->vClasses,iVar3);
        local_5c = 0;
        while (*(long *)((long)pvVar5 + (long)local_5c * 8) != 0) {
          pInToOutPart[**(long **)((long)pvVar5 + (long)local_5c * 8)] = c;
          iVar3 = Vec_IntSize(p_01);
          pInToOutNum[**(long **)((long)pvVar5 + (long)local_5c * 8)] = iVar3;
          Vec_IntPush(p_01,(iVar1 - iVar2) +
                           (int)**(undefined8 **)((long)pvVar5 + (long)local_5c * 8));
          local_5c = local_5c + 1;
        }
      }
      else {
        p = pCla->vClasses1;
        iVar4 = Vec_PtrSize(pCla->vClasses);
        plVar6 = (long *)Vec_PtrEntry(p,iVar3 - iVar4);
        pInToOutPart[*plVar6] = c;
        iVar3 = Vec_IntSize(p_01);
        pInToOutNum[*plVar6] = iVar3;
        Vec_IntPush(p_01,(iVar1 - iVar2) + (int)*plVar6);
      }
    }
    Vec_PtrWriteEntry(vParts,c,p_01);
    Vec_IntFree(p_00);
  }
  return;
}

Assistant:

void Fra_LcrRemapPartitions( Vec_Ptr_t * vParts, Fra_Cla_t * pCla, int * pInToOutPart, int * pInToOutNum )
{
    Vec_Int_t * vOne, * vOneNew;
    Aig_Obj_t ** ppClass, * pObjPi;
    int Out, Offset, i, k, c;
    // compute the LO/LI offset
    Offset = Aig_ManCoNum(pCla->pAig) - Aig_ManCiNum(pCla->pAig);
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vOne, i )
    {
        vOneNew = Vec_IntAlloc( Vec_IntSize(vOne) );
        Vec_IntForEachEntry( vOne, Out, k )
        {
            if ( Out < Vec_PtrSize(pCla->vClasses) )
            {
                ppClass = (Aig_Obj_t **)Vec_PtrEntry( pCla->vClasses, Out );
                for ( c = 0; ppClass[c]; c++ )
                {
                    pInToOutPart[(long)ppClass[c]->pNext] = i;
                    pInToOutNum[(long)ppClass[c]->pNext] = Vec_IntSize(vOneNew);
                    Vec_IntPush( vOneNew, Offset+(long)ppClass[c]->pNext );
                }
            }
            else
            {
                pObjPi = (Aig_Obj_t *)Vec_PtrEntry( pCla->vClasses1, Out - Vec_PtrSize(pCla->vClasses) );
                pInToOutPart[(long)pObjPi->pNext] = i;
                pInToOutNum[(long)pObjPi->pNext] = Vec_IntSize(vOneNew);
                Vec_IntPush( vOneNew, Offset+(long)pObjPi->pNext );
            }
        }
        // replace the class
        Vec_PtrWriteEntry( vParts, i, vOneNew );
        Vec_IntFree( vOne );
    }
}